

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintAsp(TidyDocImpl *doc,uint indent,Node *node)

{
  int iVar1;
  uint saveWrap_00;
  uint mode;
  byte local_35;
  uint saveWrap;
  Bool wrapJste;
  Bool wrapAsp;
  TidyPrintImpl *pprint;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  iVar1 = (int)(doc->config).value[0x5a].v;
  local_35 = 1;
  if (iVar1 != 0) {
    local_35 = (int)(doc->config).value[0x5c].v != 0 ^ 0xff;
  }
  saveWrap_00 = WrapOffCond(doc,(uint)(local_35 & 1));
  AddString(&doc->pprint,"<%");
  mode = 2;
  if (iVar1 != 0) {
    mode = 0x10;
  }
  PPrintText(doc,mode,indent,node);
  AddString(&doc->pprint,"%>");
  WrapOn(doc,saveWrap_00);
  return;
}

Assistant:

static void PPrintAsp( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapAsp  = cfgBool( doc, TidyWrapAsp );
    Bool wrapJste = cfgBool( doc, TidyWrapJste );
    uint saveWrap = WrapOffCond( doc, !wrapAsp || !wrapJste );

    AddString( pprint, "<%" );
    PPrintText( doc, (wrapAsp ? CDATA : COMMENT), indent, node );
    AddString( pprint, "%>" );

    /* PCondFlushLine( doc, indent ); */
    WrapOn( doc, saveWrap );
}